

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O0

void ConvertRGBtoYV12(SDL_Surface *s,SDL_Overlay *o,int monochrome,int luminance)

{
  bool bVar1;
  Uint8 *local_58;
  Uint8 *op [3];
  Uint8 *p;
  undefined4 local_30;
  int yuv [3];
  int y;
  int x;
  int luminance_local;
  int monochrome_local;
  SDL_Overlay *o_local;
  SDL_Surface *s_local;
  
  SDL_LockSurface(s);
  SDL_LockYUVOverlay(o);
  yuv[1] = 0;
  while( true ) {
    bVar1 = false;
    if (yuv[1] < s->h) {
      bVar1 = yuv[1] < o->h;
    }
    if (!bVar1) break;
    op[2] = (Uint8 *)((long)s->pixels + (long)(int)((uint)s->pitch * yuv[1]));
    op[0] = o->pixels[1] + (int)((uint)o->pitches[1] * (yuv[1] / 2));
    op[1] = o->pixels[2] + (int)((uint)o->pitches[2] * (yuv[1] / 2));
    yuv[2] = 0;
    local_58 = *o->pixels + (int)((uint)*o->pitches * yuv[1]);
    while( true ) {
      bVar1 = false;
      if (yuv[2] < s->w) {
        bVar1 = yuv[2] < o->w;
      }
      if (!bVar1) break;
      RGBtoYUV(op[2],(int *)((long)&p + 4),monochrome,luminance);
      *local_58 = (Uint8)p._4_4_;
      if ((yuv[2] % 2 == 0) && (yuv[1] % 2 == 0)) {
        *op[0] = (Uint8)yuv[0];
        *op[1] = (Uint8)local_30;
        op[0] = op[0] + 1;
        op[1] = op[1] + 1;
      }
      op[2] = op[2] + (int)(uint)s->format->BytesPerPixel;
      yuv[2] = yuv[2] + 1;
      local_58 = local_58 + 1;
    }
    yuv[1] = yuv[1] + 1;
  }
  SDL_UnlockYUVOverlay(o);
  SDL_UnlockSurface(s);
  return;
}

Assistant:

void ConvertRGBtoYV12(SDL_Surface *s, SDL_Overlay *o, int monochrome, int luminance)
{
	int x,y;
	int yuv[3];
	Uint8 *p,*op[3];

	SDL_LockSurface(s);
	SDL_LockYUVOverlay(o);

	/* Black initialization */
	/*
	memset(o->pixels[0],0,o->pitches[0]*o->h);
	memset(o->pixels[1],128,o->pitches[1]*((o->h+1)/2));
	memset(o->pixels[2],128,o->pitches[2]*((o->h+1)/2));
	*/

	/* Convert */
	for(y=0; y<s->h && y<o->h; y++)
	{
		p=((Uint8 *) s->pixels)+s->pitch*y;
		op[0]=o->pixels[0]+o->pitches[0]*y;
		op[1]=o->pixels[1]+o->pitches[1]*(y/2);
		op[2]=o->pixels[2]+o->pitches[2]*(y/2);
		for(x=0; x<s->w && x<o->w; x++)
		{
			RGBtoYUV(p, yuv, monochrome, luminance);
			*(op[0]++)=yuv[0];
			if(x%2==0 && y%2==0)
			{
				*(op[1]++)=yuv[2];
				*(op[2]++)=yuv[1];
			}
			p+=s->format->BytesPerPixel;
		}
	}

	SDL_UnlockYUVOverlay(o);
	SDL_UnlockSurface(s);
}